

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O1

bool bssl::apply_remote_features(SSL *ssl,CBS *in)

{
  unsigned_short uVar1;
  tuple<bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> this;
  SSL_CONFIG *pSVar2;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> sk;
  int iVar3;
  pointer __p;
  SSL_CIPHER *pSVar4;
  size_t sVar5;
  _Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false> _Var6;
  void *p;
  size_t sVar7;
  OPENSSL_STACK *pOVar8;
  pointer __p_00;
  size_t sVar10;
  ulong uVar11;
  iterator __begin1;
  unsigned_short *puVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  Span<const_unsigned_short> SVar16;
  uint16_t id_1;
  Array<unsigned_short> new_configured_groups;
  UniquePtr<struct_stack_st_SSL_CIPHER> unsupported;
  UniquePtr<struct_stack_st_SSL_CIPHER> supported;
  Array<unsigned_short> supported_groups;
  CBS groups;
  CBS ciphers;
  uint16_t local_aa;
  Array<unsigned_short> local_a8;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> local_98;
  _Head_base<0UL,_stack_st_SSL_CIPHER_*,_false> local_90;
  Array<unsigned_short> local_88;
  CBS local_70;
  CBS *local_60;
  CBS local_58;
  CBS local_48;
  unsigned_short *puVar9;
  
  local_60 = in;
  iVar3 = CBS_get_asn1(in,&local_58,4);
  if (iVar3 == 0) {
    return false;
  }
  local_90._M_head_impl = (stack_st_SSL_CIPHER *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_90._M_head_impl == (OPENSSL_STACK *)0x0) {
LAB_0013d9a8:
    bVar15 = false;
    goto LAB_0013da1a;
  }
  if (local_58.len != 0) {
    do {
      iVar3 = CBS_get_u16(&local_58,(uint16_t *)&local_70);
      if (iVar3 == 0) {
        bVar13 = true;
      }
      else {
        pSVar4 = SSL_get_cipher_by_value((uint16_t)local_70.data);
        if (pSVar4 == (SSL_CIPHER *)0x0) {
          bVar13 = false;
        }
        else {
          sVar5 = OPENSSL_sk_push((OPENSSL_STACK *)local_90._M_head_impl,pSVar4);
          bVar13 = sVar5 == 0;
        }
      }
      if (bVar13) goto LAB_0013d9a8;
    } while (local_58.len != 0);
  }
  _Var6._M_head_impl =
       *(SSLCipherPreferenceList **)
        &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
         super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
  if ((tuple<bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>)_Var6._M_head_impl ==
      (_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)0x0) {
    _Var6._M_head_impl =
         *(SSLCipherPreferenceList **)
          &(((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->cipher_list)._M_t.
           super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
  }
  pOVar8 = *(OPENSSL_STACK **)_Var6._M_head_impl;
  local_98._M_head_impl = (stack_st_SSL_CIPHER *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_98._M_head_impl != (OPENSSL_STACK *)0x0) {
    sVar5 = OPENSSL_sk_num(pOVar8);
    if (sVar5 != 0) {
      sVar10 = 0;
      do {
        p = OPENSSL_sk_value(pOVar8,sVar10);
        iVar3 = OPENSSL_sk_find((OPENSSL_STACK *)local_90._M_head_impl,(size_t *)0x0,p,
                                sk_SSL_CIPHER_call_cmp_func);
        cVar14 = '\x05';
        if (iVar3 == 0) {
          sVar7 = OPENSSL_sk_push((OPENSSL_STACK *)local_98._M_head_impl,p);
          cVar14 = sVar7 == 0;
        }
        if ((cVar14 != '\x05') && (cVar14 != '\0')) goto LAB_0013da0e;
        sVar10 = sVar10 + 1;
      } while (sVar5 != sVar10);
    }
    sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)local_98._M_head_impl);
    if ((sVar5 != 0) &&
       ((_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)
        *(_Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> *)
         &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t
            .super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
          super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> ==
        (SSLCipherPreferenceList *)0x0)) {
      __p_00 = (pointer)OPENSSL_malloc(0x10);
      if (__p_00 == (pointer)0x0) {
        __p_00 = (pointer)0x0;
      }
      else {
        (__p_00->ciphers)._M_t.super___uniq_ptr_impl<stack_st_SSL_CIPHER,_bssl::internal::Deleter>.
        _M_t.super__Tuple_impl<0UL,_stack_st_SSL_CIPHER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_SSL_CIPHER_*,_false>._M_head_impl =
             (stack_st_SSL_CIPHER *)0x0;
        __p_00->in_group_flags = (bool *)0x0;
      }
      local_70.data = (uint8_t *)0x0;
      std::__uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)
                 &((ssl->config)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list,
                 __p_00);
      std::unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter> *)&local_70);
      this.super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter> *)
            &(((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list)._M_t.
             super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>;
      if ((this.super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>._M_head_impl ==
           (_Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>)0x0) ||
         (bVar13 = SSLCipherPreferenceList::Init
                             ((SSLCipherPreferenceList *)
                              this.
                              super__Tuple_impl<0UL,_bssl::SSLCipherPreferenceList_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::SSLCipherPreferenceList_*,_false>.
                              _M_head_impl,
                              (SSLCipherPreferenceList *)
                              (((ssl->ctx)._M_t.
                                super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->
                              cipher_list)._M_t.
                              super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>
                             ), !bVar13)) goto LAB_0013da0e;
    }
    sk._M_head_impl = local_98._M_head_impl;
    sVar5 = OPENSSL_sk_num((OPENSSL_STACK *)local_98._M_head_impl);
    if (sVar5 != 0) {
      sVar10 = 0;
      do {
        pSVar4 = (SSL_CIPHER *)OPENSSL_sk_value((OPENSSL_STACK *)sk._M_head_impl,sVar10);
        SSLCipherPreferenceList::Remove
                  ((SSLCipherPreferenceList *)
                   (((ssl->config)._M_t.
                     super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->cipher_list).
                   _M_t.
                   super___uniq_ptr_impl<bssl::SSLCipherPreferenceList,_bssl::internal::Deleter>,
                   pSVar4);
        sVar10 = sVar10 + 1;
      } while (sVar5 != sVar10);
    }
    pOVar8 = (OPENSSL_STACK *)SSL_get_ciphers((SSL *)ssl);
    sVar5 = OPENSSL_sk_num(pOVar8);
    if ((sVar5 == 0) || (iVar3 = CBS_get_asn1(local_60,&local_70,4), iVar3 == 0)) goto LAB_0013da0e;
    local_88.data_ = (unsigned_short *)0x0;
    local_88.size_ = 0;
    bVar13 = Array<unsigned_short>::InitUninitialized(&local_88,local_70.len >> 1);
    if (bVar13) {
      uVar11 = 0;
      do {
        if (local_70.len == 0) {
          SVar16 = tls1_get_grouplist((ssl->s3->hs)._M_t.
                                      super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>.
                                      _M_head_impl);
          sVar5 = SVar16.size_;
          puVar9 = SVar16.data_;
          local_a8.data_ = (unsigned_short *)0x0;
          local_a8.size_ = 0;
          bVar13 = Array<unsigned_short>::InitUninitialized(&local_a8,sVar5);
          if (!bVar13) goto LAB_0013dbe7;
          if (sVar5 != 0) {
            uVar11 = 0;
            goto LAB_0013da96;
          }
          uVar11 = 0;
          goto LAB_0013dae3;
        }
        iVar3 = CBS_get_u16(&local_70,(uint16_t *)&local_a8);
        if (iVar3 != 0) {
          if (local_88.size_ <= uVar11) goto LAB_0013dc02;
          local_88.data_[uVar11] = (unsigned_short)local_a8.data_;
          uVar11 = uVar11 + 1;
        }
      } while (iVar3 != 0);
    }
    bVar15 = false;
    goto LAB_0013dbf3;
  }
LAB_0013da0e:
  bVar15 = false;
  goto LAB_0013da10;
LAB_0013da96:
  do {
    sVar10 = SVar16.size_;
    if (local_88.size_ != 0) {
      uVar1 = *SVar16.data_;
      sVar7 = 0;
      do {
        bVar13 = false;
        if (*(unsigned_short *)((long)local_88.data_ + sVar7) == uVar1) {
          bVar13 = true;
          sVar10 = sVar7;
          break;
        }
        sVar10 = sVar7 + 2;
        bVar15 = local_88.size_ * 2 - 2 != sVar7;
        sVar7 = sVar10;
      } while (bVar15);
      if (bVar13) {
        if (local_a8.size_ <= uVar11) goto LAB_0013dc02;
        local_a8.data_[uVar11] = uVar1;
        uVar11 = uVar11 + 1;
      }
    }
    puVar12 = SVar16.data_ + 1;
    SVar16.size_ = sVar10;
    SVar16.data_ = puVar12;
  } while (puVar12 != puVar9 + sVar5);
LAB_0013dae3:
  if (uVar11 == 0) {
LAB_0013dbe7:
    bVar15 = false;
  }
  else {
    if (local_a8.size_ < uVar11) {
LAB_0013dc02:
      abort();
    }
    pSVar2 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
    local_a8.size_ = uVar11;
    OPENSSL_free((pSVar2->supported_group_list).data_);
    (pSVar2->supported_group_list).data_ = (unsigned_short *)0x0;
    (pSVar2->supported_group_list).size_ = 0;
    (pSVar2->supported_group_list).data_ = local_a8.data_;
    (pSVar2->supported_group_list).size_ = local_a8.size_;
    local_a8.data_ = (unsigned_short *)0x0;
    local_a8.size_ = 0;
    local_48.data = (uint8_t *)0x0;
    local_48.len = 0;
    iVar3 = CBS_get_optional_asn1(local_60,&local_48,(int *)0x0,0x80000000);
    if (iVar3 == 0) goto LAB_0013dbe7;
    bVar13 = false;
    do {
      if (local_48.len == 0) goto LAB_0013dbce;
      iVar3 = CBS_get_u16(&local_48,&local_aa);
      if (iVar3 == 0) {
        iVar3 = 1;
      }
      else {
        if (local_aa == 0x4469) {
          if ((((ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
                _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10e & 0x20)
              == 0) goto LAB_0013dbb2;
        }
        else if ((local_aa == 0x44cd) &&
                ((((ssl->config)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->field_0x10e &
                 0x20) != 0)) {
LAB_0013dbb2:
          bVar13 = true;
          iVar3 = 0xf;
          goto LAB_0013dbc5;
        }
        iVar3 = 0;
      }
LAB_0013dbc5:
    } while (iVar3 == 0);
    if (iVar3 != 0xf) goto LAB_0013dbe7;
LAB_0013dbce:
    bVar15 = true;
    if (!bVar13) {
      Vector<bssl::ALPSConfig>::clear
                (&((ssl->config)._M_t.
                   super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->alps_configs);
    }
  }
  Array<unsigned_short>::~Array(&local_a8);
LAB_0013dbf3:
  OPENSSL_free(local_88.data_);
LAB_0013da10:
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&local_98);
LAB_0013da1a:
  std::unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SSL_CIPHER,_bssl::internal::Deleter> *)&local_90);
  return bVar15;
}

Assistant:

static bool apply_remote_features(SSL *ssl, CBS *in) {
  CBS ciphers;
  if (!CBS_get_asn1(in, &ciphers, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> supported(sk_SSL_CIPHER_new_null());
  if (!supported) {
    return false;
  }
  while (CBS_len(&ciphers)) {
    uint16_t id;
    if (!CBS_get_u16(&ciphers, &id)) {
      return false;
    }
    const SSL_CIPHER *cipher = SSL_get_cipher_by_value(id);
    if (!cipher) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(supported.get(), cipher)) {
      return false;
    }
  }
  STACK_OF(SSL_CIPHER) *configured =
      ssl->config->cipher_list ? ssl->config->cipher_list->ciphers.get()
                               : ssl->ctx->cipher_list->ciphers.get();
  bssl::UniquePtr<STACK_OF(SSL_CIPHER)> unsupported(sk_SSL_CIPHER_new_null());
  if (!unsupported) {
    return false;
  }
  for (const SSL_CIPHER *configured_cipher : configured) {
    if (sk_SSL_CIPHER_find(supported.get(), nullptr, configured_cipher)) {
      continue;
    }
    if (!sk_SSL_CIPHER_push(unsupported.get(), configured_cipher)) {
      return false;
    }
  }
  if (sk_SSL_CIPHER_num(unsupported.get()) && !ssl->config->cipher_list) {
    ssl->config->cipher_list = bssl::MakeUnique<SSLCipherPreferenceList>();
    if (!ssl->config->cipher_list ||
        !ssl->config->cipher_list->Init(*ssl->ctx->cipher_list)) {
      return false;
    }
  }
  for (const SSL_CIPHER *unsupported_cipher : unsupported.get()) {
    ssl->config->cipher_list->Remove(unsupported_cipher);
  }
  if (sk_SSL_CIPHER_num(SSL_get_ciphers(ssl)) == 0) {
    return false;
  }

  CBS groups;
  if (!CBS_get_asn1(in, &groups, CBS_ASN1_OCTETSTRING)) {
    return false;
  }
  Array<uint16_t> supported_groups;
  if (!supported_groups.InitForOverwrite(CBS_len(&groups) / 2)) {
    return false;
  }
  size_t idx = 0;
  while (CBS_len(&groups)) {
    uint16_t group;
    if (!CBS_get_u16(&groups, &group)) {
      return false;
    }
    supported_groups[idx++] = group;
  }
  Span<const uint16_t> configured_groups =
      tls1_get_grouplist(ssl->s3->hs.get());
  Array<uint16_t> new_configured_groups;
  if (!new_configured_groups.InitForOverwrite(configured_groups.size())) {
    return false;
  }
  idx = 0;
  for (uint16_t configured_group : configured_groups) {
    bool ok = false;
    for (uint16_t supported_group : supported_groups) {
      if (supported_group == configured_group) {
        ok = true;
        break;
      }
    }
    if (ok) {
      new_configured_groups[idx++] = configured_group;
    }
  }
  if (idx == 0) {
    return false;
  }
  new_configured_groups.Shrink(idx);
  ssl->config->supported_group_list = std::move(new_configured_groups);

  CBS alps;
  CBS_init(&alps, nullptr, 0);
  if (!CBS_get_optional_asn1(in, &alps, /*out_present=*/nullptr,
                             kHandoffTagALPS)) {
    return false;
  }
  bool supports_alps = false;
  while (CBS_len(&alps) != 0) {
    uint16_t id;
    if (!CBS_get_u16(&alps, &id)) {
      return false;
    }
    // For now, we support two ALPS codepoints, so we need to extract both
    // codepoints, and then filter what the handshaker might try to send.
    if ((id == TLSEXT_TYPE_application_settings &&
         ssl->config->alps_use_new_codepoint) ||
        (id == TLSEXT_TYPE_application_settings_old &&
         !ssl->config->alps_use_new_codepoint)) {
      supports_alps = true;
      break;
    }
  }
  if (!supports_alps) {
    ssl->config->alps_configs.clear();
  }

  return true;
}